

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_pnext_chain_pdf2(Impl *this,Value *pnext,void **outpNext)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar1;
  bool bVar2;
  LogLevel LVar3;
  ConstValueIterator pGVar4;
  Type this_00;
  VkPhysicalDeviceRobustness2FeaturesEXT *local_a8;
  VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *view_2d_of_3d;
  VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT *prim_generated;
  VkPhysicalDeviceShaderObjectFeaturesEXT *shader_object;
  VkPhysicalDeviceDescriptorBufferFeaturesEXT *descriptor_buffer;
  VkPhysicalDeviceMeshShaderFeaturesNV *mesh_shader_1;
  VkPhysicalDeviceMeshShaderFeaturesEXT *mesh_shader;
  VkPhysicalDeviceFragmentShadingRateFeaturesKHR *fragment_shading_rate;
  VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV *fragment_shading_rate_enums;
  VkPhysicalDeviceImageRobustnessFeaturesEXT *image_robustness;
  VkPhysicalDeviceRobustness2FeaturesEXT *robustness2;
  VkBaseInStructure *new_struct;
  Value *pVStack_48;
  VkStructureType sType;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *next;
  ConstValueIterator itr;
  VkBaseInStructure *chain;
  VkBaseInStructure *ret;
  void **outpNext_local;
  Value *pnext_local;
  Impl *this_local;
  
  chain = (VkBaseInStructure *)0x0;
  itr = (ConstValueIterator)0x0;
  ret = (VkBaseInStructure *)outpNext;
  outpNext_local = (void **)pnext;
  pnext_local = (Value *)this;
  next = rapidjson::
         GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
         ::Begin(pnext);
  do {
    pGVar1 = next;
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::End((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)outpNext_local);
    if (pGVar1 == pGVar4) {
      *(VkBaseInStructure **)ret = chain;
      return true;
    }
    pVStack_48 = next;
    this_00 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>
                        ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)next,"sType");
    new_struct._4_4_ =
         rapidjson::
         GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
         ::GetInt(this_00);
    robustness2 = (VkPhysicalDeviceRobustness2FeaturesEXT *)0x0;
    if (new_struct._4_4_ == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_NV) {
      descriptor_buffer = (VkPhysicalDeviceDescriptorBufferFeaturesEXT *)0x0;
      bVar2 = parse_mesh_shader_features_nv
                        (this,pVStack_48,(VkPhysicalDeviceMeshShaderFeaturesNV **)&descriptor_buffer
                        );
      if (!bVar2) {
        return false;
      }
      robustness2 = (VkPhysicalDeviceRobustness2FeaturesEXT *)descriptor_buffer;
    }
    else if (new_struct._4_4_ ==
             VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR) {
      mesh_shader = (VkPhysicalDeviceMeshShaderFeaturesEXT *)0x0;
      bVar2 = parse_fragment_shading_rate_features
                        (this,pVStack_48,
                         (VkPhysicalDeviceFragmentShadingRateFeaturesKHR **)&mesh_shader);
      if (!bVar2) {
        return false;
      }
      robustness2 = (VkPhysicalDeviceRobustness2FeaturesEXT *)mesh_shader;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT) {
      image_robustness = (VkPhysicalDeviceImageRobustnessFeaturesEXT *)0x0;
      bVar2 = parse_robustness2_features
                        (this,pVStack_48,
                         (VkPhysicalDeviceRobustness2FeaturesEXT **)&image_robustness);
      if (!bVar2) {
        return false;
      }
      robustness2 = (VkPhysicalDeviceRobustness2FeaturesEXT *)image_robustness;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT) {
      shader_object = (VkPhysicalDeviceShaderObjectFeaturesEXT *)0x0;
      bVar2 = parse_descriptor_buffer_features
                        (this,pVStack_48,
                         (VkPhysicalDeviceDescriptorBufferFeaturesEXT **)&shader_object);
      if (!bVar2) {
        return false;
      }
      robustness2 = (VkPhysicalDeviceRobustness2FeaturesEXT *)shader_object;
    }
    else if (new_struct._4_4_ ==
             VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_ENUMS_FEATURES_NV) {
      fragment_shading_rate = (VkPhysicalDeviceFragmentShadingRateFeaturesKHR *)0x0;
      bVar2 = parse_fragment_shading_rate_enums_features
                        (this,pVStack_48,
                         (VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV **)
                         &fragment_shading_rate);
      if (!bVar2) {
        return false;
      }
      robustness2 = (VkPhysicalDeviceRobustness2FeaturesEXT *)fragment_shading_rate;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_EXT) {
      mesh_shader_1 = (VkPhysicalDeviceMeshShaderFeaturesNV *)0x0;
      bVar2 = parse_mesh_shader_features
                        (this,pVStack_48,(VkPhysicalDeviceMeshShaderFeaturesEXT **)&mesh_shader_1);
      if (!bVar2) {
        return false;
      }
      robustness2 = (VkPhysicalDeviceRobustness2FeaturesEXT *)mesh_shader_1;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_ROBUSTNESS_FEATURES) {
      fragment_shading_rate_enums = (VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV *)0x0;
      bVar2 = parse_image_robustness_features
                        (this,pVStack_48,
                         (VkPhysicalDeviceImageRobustnessFeaturesEXT **)&fragment_shading_rate_enums
                        );
      if (!bVar2) {
        return false;
      }
      robustness2 = (VkPhysicalDeviceRobustness2FeaturesEXT *)fragment_shading_rate_enums;
    }
    else if (new_struct._4_4_ ==
             VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PRIMITIVES_GENERATED_QUERY_FEATURES_EXT) {
      view_2d_of_3d = (VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *)0x0;
      bVar2 = parse_primitives_generated_query_features
                        (this,pVStack_48,
                         (VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT **)&view_2d_of_3d);
      if (!bVar2) {
        return false;
      }
      robustness2 = (VkPhysicalDeviceRobustness2FeaturesEXT *)view_2d_of_3d;
    }
    else if (new_struct._4_4_ == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_2D_VIEW_OF_3D_FEATURES_EXT)
    {
      local_a8 = (VkPhysicalDeviceRobustness2FeaturesEXT *)0x0;
      bVar2 = parse_2d_view_of_3d_features
                        (this,pVStack_48,(VkPhysicalDeviceImage2DViewOf3DFeaturesEXT **)&local_a8);
      if (!bVar2) {
        return false;
      }
      robustness2 = local_a8;
    }
    else {
      if (new_struct._4_4_ != VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_OBJECT_FEATURES_EXT) {
        LVar3 = get_thread_log_level();
        if (((int)LVar3 < 3) &&
           (bVar2 = Internal::log_thread_callback
                              (LOG_ERROR,"Failed to parse pNext chain for sType: %d\n",
                               (ulong)new_struct._4_4_), !bVar2)) {
          fprintf(_stderr,"Fossilize ERROR: Failed to parse pNext chain for sType: %d\n",
                  (ulong)new_struct._4_4_);
        }
        return false;
      }
      prim_generated = (VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT *)0x0;
      bVar2 = parse_shader_object_features
                        (this,pVStack_48,(VkPhysicalDeviceShaderObjectFeaturesEXT **)&prim_generated
                        );
      if (!bVar2) {
        return false;
      }
      robustness2 = (VkPhysicalDeviceRobustness2FeaturesEXT *)prim_generated;
    }
    robustness2->sType = new_struct._4_4_;
    robustness2->pNext = (void *)0x0;
    if (itr == (ConstValueIterator)0x0) {
      chain = (VkBaseInStructure *)robustness2;
    }
    else {
      (itr->data_).o.members = (Member *)robustness2;
    }
    itr = (ConstValueIterator)robustness2;
    next = next + 1;
  } while( true );
}

Assistant:

bool StateReplayer::Impl::parse_pnext_chain_pdf2(const Value &pnext, void **outpNext)
{
	VkBaseInStructure *ret = nullptr;
	VkBaseInStructure *chain = nullptr;

	for (auto itr = pnext.Begin(); itr != pnext.End(); ++itr)
	{
		auto &next = *itr;
		auto sType = static_cast<VkStructureType>(next["sType"].GetInt());
		VkBaseInStructure *new_struct = nullptr;

		switch (sType)
		{
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT:
		{
			VkPhysicalDeviceRobustness2FeaturesEXT *robustness2 = nullptr;
			if (!parse_robustness2_features(next, &robustness2))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(robustness2);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_ROBUSTNESS_FEATURES_EXT:
		{
			VkPhysicalDeviceImageRobustnessFeaturesEXT *image_robustness = nullptr;
			if (!parse_image_robustness_features(next, &image_robustness))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(image_robustness);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_ENUMS_FEATURES_NV:
		{
			VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV *fragment_shading_rate_enums = nullptr;
			if (!parse_fragment_shading_rate_enums_features(next, &fragment_shading_rate_enums))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(fragment_shading_rate_enums);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR:
		{
			VkPhysicalDeviceFragmentShadingRateFeaturesKHR *fragment_shading_rate = nullptr;
			if (!parse_fragment_shading_rate_features(next, &fragment_shading_rate))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(fragment_shading_rate);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_EXT:
		{
			VkPhysicalDeviceMeshShaderFeaturesEXT *mesh_shader = nullptr;
			if (!parse_mesh_shader_features(next, &mesh_shader))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(mesh_shader);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_NV:
		{
			VkPhysicalDeviceMeshShaderFeaturesNV *mesh_shader = nullptr;
			if (!parse_mesh_shader_features_nv(next, &mesh_shader))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(mesh_shader);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT:
		{
			VkPhysicalDeviceDescriptorBufferFeaturesEXT *descriptor_buffer = nullptr;
			if (!parse_descriptor_buffer_features(next, &descriptor_buffer))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(descriptor_buffer);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_OBJECT_FEATURES_EXT:
		{
			VkPhysicalDeviceShaderObjectFeaturesEXT *shader_object = nullptr;
			if (!parse_shader_object_features(next, &shader_object))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(shader_object);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PRIMITIVES_GENERATED_QUERY_FEATURES_EXT:
		{
			VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT *prim_generated = nullptr;
			if (!parse_primitives_generated_query_features(next, &prim_generated))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(prim_generated);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_2D_VIEW_OF_3D_FEATURES_EXT:
		{
			VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *view_2d_of_3d = nullptr;
			if (!parse_2d_view_of_3d_features(next, &view_2d_of_3d))
				return false;
			new_struct = reinterpret_cast<VkBaseInStructure *>(view_2d_of_3d);
			break;
		}

		default:
			LOGE_LEVEL("Failed to parse pNext chain for sType: %d\n", int(sType));
			return false;
		}

		new_struct->sType = sType;
		new_struct->pNext = nullptr;

		if (!chain)
		{
			chain = new_struct;
			ret = chain;
		}
		else
		{
			chain->pNext = new_struct;
			chain = new_struct;
		}
	}

	*outpNext = ret;
	return true;
}